

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::print_typed_attr<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
          *attr,string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  tinyusdz tVar2;
  tinyusdz tVar3;
  string *psVar4;
  undefined1 uVar5;
  bool bVar6;
  bool bVar7;
  ostream *poVar8;
  long lVar9;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  bool bVar10;
  bool bVar11;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> a;
  stringstream ss;
  string local_268;
  undefined4 local_23c;
  TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
  *local_238;
  string *local_230;
  string *local_228;
  undefined1 local_220 [8];
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_218;
  undefined1 local_200;
  undefined1 local_1ff;
  TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_238 = attr;
  local_230 = name;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  tVar2 = this[0x228];
  if ((((tVar2 != (tinyusdz)0x0) || (*(long *)(this + 0x218) != *(long *)(this + 0x210))) ||
      (this[0x208] != (tinyusdz)0x0)) || (this[0x270] == (tinyusdz)0x1)) {
    lVar9 = *(long *)(this + 0x218);
    if ((lVar9 == *(long *)(this + 0x210) && tVar2 == (tinyusdz)0x0) &&
       (this[0x270] == (tinyusdz)0x0)) {
      tVar3 = this[0x208];
    }
    else {
      tVar3 = (tinyusdz)0x0;
    }
    bVar10 = lVar9 != *(long *)(this + 0x210);
    local_228 = __return_storage_ptr__;
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
    ::optional((optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                *)local_220,
               (optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                *)(this + 0x228));
    uVar5 = local_200;
    bVar7 = local_220[0];
    indent_00 = (uint32_t)lVar9;
    if (local_220[0] == true) {
      if (local_1f8._dirty == true) {
        TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
        ::update(&local_1f8);
      }
      local_23c = (undefined4)
                  CONCAT71((int7)((ulong)local_1f8._samples.
                                         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                                         ._M_impl.super__Vector_impl_data._M_finish >> 8),
                           local_1f8._samples.
                           super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_finish !=
                           local_1f8._samples.
                           super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    }
    else {
      local_23c = 0;
    }
    if (((local_220[0] == true) && (local_1ff == '\0')) && (local_200 == 0)) {
      bVar11 = local_1f8._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_1f8._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar11 = false;
    }
    bVar6 = AttrMetas::authored((AttrMetas *)this);
    psVar4 = local_230;
    if (((bVar6) || ((byte)(bVar10 & ((byte)tVar2 ^ 1) | bVar11) != 1)) ||
       (n_01 = n, (tVar3 != (tinyusdz)0x0 || this[0x270] != (tinyusdz)0x0) || (bVar7 & uVar5) != 0))
    {
      pprint::Indent_abi_cxx11_(&local_268,(pprint *)((ulong)local_230 & 0xffffffff),n);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      value::TypeTraits<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>::
      type_name_abi_cxx11_();
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(char *)(local_238->_metas).interpolation,
                 (long)(local_238->_metas).elementSize);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if (this[0x270] == (tinyusdz)0x1) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
      }
      else if ((bVar7 & uVar5) != 0) {
        local_268._M_dataplus._M_p = (char *)0x0;
        local_268._M_string_length = 0;
        local_268.field_2._M_allocated_capacity = 0;
        if (local_220[0] == false) goto LAB_002efe16;
        if ((local_1ff == '\0') && (local_200 == 1)) {
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::operator=
                    ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     &local_268,&local_218);
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
          ::std::operator<<(local_1a8,
                            (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             *)&local_268);
        }
        else {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = [InternalError]",0x12);
        }
        if (local_268._M_dataplus._M_p != (char *)0x0) {
          operator_delete(local_268._M_dataplus._M_p,
                          local_268.field_2._M_allocated_capacity - (long)local_268._M_dataplus._M_p
                         );
        }
      }
      bVar7 = AttrMetas::authored((AttrMetas *)this);
      if (bVar7) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
        print_attr_metas_abi_cxx11_(&local_268,this,(AttrMeta *)(ulong)((int)psVar4 + 1),indent_00);
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
        pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)psVar4 & 0xffffffff),n_00);
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX;
    }
    psVar4 = local_230;
    if ((char)local_23c != '\0') {
      pprint::Indent_abi_cxx11_(&local_268,(pprint *)((ulong)local_230 & 0xffffffff),n_01);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
      paVar1 = &local_268.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      value::TypeTraits<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>::
      type_name_abi_cxx11_();
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(char *)(local_238->_metas).interpolation,
                 (long)(local_238->_metas).elementSize);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
      if (local_220[0] == false) {
LAB_002efe16:
        __assert_fail("has_value()",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                      ,0x584,
                      "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<std::array<float, 3>>>>::value() const [T = tinyusdz::Animatable<std::vector<std::array<float, 3>>>]"
                     );
      }
      print_typed_timesamples<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                (&local_268,(tinyusdz *)&local_1f8,
                 (TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)((ulong)psVar4 & 0xffffffff),indent_00);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX_00;
    }
    if (*(long *)(this + 0x218) != *(long *)(this + 0x210)) {
      pprint::Indent_abi_cxx11_(&local_268,(pprint *)((ulong)psVar4 & 0xffffffff),n_01);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      value::TypeTraits<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>::
      type_name_abi_cxx11_();
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(char *)(local_238->_metas).interpolation,
                 (long)(local_238->_metas).elementSize);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
      lVar9 = (*(long *)(this + 0x218) - (long)*(Path **)(this + 0x210) >> 4) * 0x4ec4ec4ec4ec4ec5;
      if (lVar9 == 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
      }
      else if (lVar9 == 1) {
        ::std::operator<<(local_1a8,*(Path **)(this + 0x210));
      }
      else {
        ::std::operator<<(local_1a8,
                          (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x210))
        ;
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
    __return_storage_ptr__ = local_228;
    if (local_220[0] == true) {
      nonstd::optional_lite::detail::
      storage_t<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
      ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                        *)&local_218);
      __return_storage_ptr__ = local_228;
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}